

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O2

void __thiscall Timer::run_local(Timer *this)

{
  unique_lock<std::mutex> *this_00;
  TimerNode *pTVar1;
  bool bVar2;
  long lVar3;
  type diff;
  value_type s;
  unique_lock<std::mutex> lock;
  duration<long,_std::ratio<1L,_1000000000L>_> local_98;
  TimerNode local_90;
  undefined1 local_50 [32];
  
  this_00 = (unique_lock<std::mutex> *)(local_50 + 0x10);
  do {
    if (((this->tm_running)._M_base._M_i & 1U) == 0) {
      return;
    }
    std::unique_lock<std::mutex>::unique_lock(this_00,&this->tm_mutex);
    pTVar1 = (this->tm_queue).c.
             super__Vector_base<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pTVar1 == (this->tm_queue).c.
                  super__Vector_base<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      std::condition_variable::wait((unique_lock *)&this->tm_cond);
    }
    else {
      TimerNode::TimerNode(&local_90,pTVar1);
      lVar3 = std::chrono::_V2::system_clock::now();
      local_98.__r = (long)local_90.tn_tm_point.__d.__r - lVar3;
      if (local_98.__r < 1000000) {
        std::
        priority_queue<Timer::TimerNode,_std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>,_std::less<Timer::TimerNode>_>
        ::pop(&this->tm_queue);
        bVar2 = hash_map<int,_Timer::IdState>::is_key_exist(&this->tm_id_state_map,&local_90.tn_id);
        if (bVar2) {
          if (local_90.tn_is_period == true) {
            lVar3 = std::chrono::_V2::system_clock::now();
            local_90.tn_tm_point.__d.__r = (duration)(local_90.tn_period.__r * 1000000 + lVar3);
LAB_001061af:
            std::
            priority_queue<Timer::TimerNode,_std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>,_std::less<Timer::TimerNode>_>
            ::push(&this->tm_queue,&local_90);
          }
          else if ((local_90.tn_is_repeated == true) && (0 < local_90.tn_repeated_num)) {
            lVar3 = std::chrono::_V2::system_clock::now();
            local_90.tn_tm_point.__d.__r = (duration)(local_90.tn_period.__r * 1000000 + lVar3);
            local_90.tn_repeated_num = local_90.tn_repeated_num + -1;
            goto LAB_001061af;
          }
          std::unique_lock<std::mutex>::unlock(this_00);
          Threadpool::post_task<std::function<void()>>
                    ((Threadpool *)local_50,(function<void_()> *)&this->tm_thread_pool);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
        }
      }
      else {
        std::condition_variable::wait_for<long,std::ratio<1l,1000000000l>>
                  (&this->tm_cond,this_00,&local_98);
      }
      std::_Function_base::~_Function_base(&local_90.tn_callback.super__Function_base);
    }
    std::unique_lock<std::mutex>::~unique_lock(this_00);
  } while( true );
}

Assistant:

void run_local()
    {
        while (tm_running.load()) {
            unique_lock<mutex> lock(tm_mutex);
            if (tm_queue.empty()) {
                tm_cond.wait(lock);
                continue;
            }
            auto s = tm_queue.top();
            auto diff = s.tn_tm_point - chrono::high_resolution_clock::now();
            if (chrono::duration_cast<chrono::milliseconds>(diff).count() > 0) {
                tm_cond.wait_for(lock, diff);
                continue;
            } else {
                tm_queue.pop();
                if(!tm_id_state_map.is_key_exist(s.tn_id))
                {
                    continue;
                }
                if(s.tn_is_period)
                {
                    s.tn_tm_point = chrono::high_resolution_clock::now() + s.tn_period;
                    tm_queue.push(s);
                }
                else if(s.tn_is_repeated && s.tn_repeated_num>0)
                {
                    s.tn_tm_point = chrono::high_resolution_clock::now() + s.tn_period;
                    s.tn_repeated_num--;
                    tm_queue.push(s);
                }
                lock.unlock();
                tm_thread_pool.post_task(move(s.tn_callback));
            }
        }
    }